

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_save.c
# Opt level: O0

void * track_extend(smf_track_t *track,int length)

{
  void *buf;
  int length_local;
  smf_track_t *track_local;
  
  if (track->smf == (smf_t *)0x0) {
    __assert_fail("track->smf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x7d,"void *track_extend(smf_track_t *, const int)");
  }
  track_local = (smf_track_t *)smf_extend(track->smf,length);
  if (track_local == (smf_track_t *)0x0) {
    track_local = (smf_track_t *)0x0;
  }
  else {
    track->file_buffer_length = length + track->file_buffer_length;
    if (track->file_buffer == (void *)0x0) {
      track->file_buffer = track_local;
    }
  }
  return track_local;
}

Assistant:

static void *
track_extend(smf_track_t *track, const int length)
{
	void *buf;

	assert(track->smf);

	buf = smf_extend(track->smf, length);
	if (buf == NULL)
		return (NULL);

	track->file_buffer_length += length;
	if (track->file_buffer == NULL)
		track->file_buffer = buf;

	return (buf);
}